

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O2

Constraint * create_with_side_effect_constraint(_func_void_void_ptr *callback,void *data)

{
  Constraint *pCVar1;
  
  pCVar1 = create_constraint();
  pCVar1->type = CGREEN_CALL_CONSTRAINT;
  pCVar1->name = "cause side effect";
  pCVar1->side_effect_callback = callback;
  pCVar1->side_effect_data = data;
  pCVar1->execute = execute_sideeffect;
  return pCVar1;
}

Assistant:

Constraint *create_with_side_effect_constraint(void (*callback)(void *), void *data) {
    Constraint* constraint = create_constraint();
    constraint->type = CGREEN_CALL_CONSTRAINT;

    constraint->name = "cause side effect";
    constraint->side_effect_callback = callback;
    constraint->side_effect_data = data;
    constraint->execute = &execute_sideeffect;

    return constraint;
}